

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

bool __thiscall cppurses::Key::Press::filter_send(Press *this,Widget *filter)

{
  Widget *pWVar1;
  int iVar2;
  undefined2 local_1c;
  char local_1a;
  Widget *local_18;
  Widget *filter_local;
  Press *this_local;
  
  pWVar1 = (this->super_Event).super_Input_event.super_Event.receiver_;
  local_1c = *(undefined2 *)&(this->super_Event).super_Input_event.field_0x1c;
  local_18 = filter;
  filter_local = (Widget *)this;
  local_1a = key_to_char(*(Code *)&(this->super_Event).super_Input_event.field_0x1c);
  iVar2 = (*filter->_vptr_Widget[0x23])(filter,pWVar1,&local_1c);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool Key::Press::filter_send(Widget& filter) const {
    return filter.key_press_event_filter(receiver_,
                                         Key::State{key_, key_to_char(key_)});
}